

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

bool duckdb::StringValueResult::AddRow(StringValueResult *result,idx_t buffer_pos)

{
  LinePosition *error_position;
  ulong uVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  CSVErrorType local_19;
  
  uVar1 = (result->super_ScannerResult).last_position.buffer_pos;
  if (uVar1 <= buffer_pos) {
    error_position = &(result->super_ScannerResult).last_position;
    if ((result->super_ScannerResult).quoted == true) {
      if ((result->super_ScannerResult).unquoted == false) {
        local_19 = UNTERMINATED_QUOTES;
        LineError::Insert(&result->current_errors,&local_19,&result->cur_col_id,
                          &result->chunk_col_id,error_position,0);
      }
      uVar1 = (result->super_ScannerResult).quoted_position;
      lVar3 = ~uVar1 + buffer_pos;
      if ((lVar3 != 0) && (result->ignore_empty_values == true)) {
        pcVar4 = result->buffer_ptr + buffer_pos;
        do {
          pcVar4 = pcVar4 + -1;
          if (*pcVar4 != ' ') goto LAB_00d2a03d;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
        lVar3 = 0;
      }
LAB_00d2a03d:
      AddPossiblyEscapedValue
                (result,buffer_pos,result->buffer_ptr + uVar1 + 1,lVar3 - 1,
                 buffer_pos < (result->super_ScannerResult).last_position.buffer_pos + 2);
      (result->super_ScannerResult).quoted = false;
    }
    else if ((result->super_ScannerResult).escaped == true) {
      AddPossiblyEscapedValue
                (result,buffer_pos,result->buffer_ptr + uVar1,buffer_pos - uVar1,buffer_pos == uVar1
                );
    }
    else {
      AddValueToVector(result,result->buffer_ptr + uVar1,buffer_pos - uVar1,false);
    }
    lVar3 = 1;
    if ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
        new_line.value == CARRY_ON) {
      lVar3 = (ulong)(((result->super_ScannerResult).states)->states[1] != RECORD_SEPARATOR) + 1;
    }
    error_position->buffer_pos = lVar3 + buffer_pos;
  }
  bVar2 = AddRowInternal(result);
  return bVar2;
}

Assistant:

bool StringValueResult::AddRow(StringValueResult &result, const idx_t buffer_pos) {
	if (result.last_position.buffer_pos <= buffer_pos) {
		// We add the value
		if (result.quoted) {
			AddQuotedValue(result, buffer_pos);
		} else {
			char *value_ptr = result.buffer_ptr + result.last_position.buffer_pos;
			idx_t size = buffer_pos - result.last_position.buffer_pos;
			if (result.escaped) {
				AddPossiblyEscapedValue(result, buffer_pos, value_ptr, size, size == 0);
			} else {
				result.AddValueToVector(value_ptr, size);
			}
		}
		if (result.state_machine.dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
			if (result.states.states[1] == CSVState::RECORD_SEPARATOR) {
				// Even though this is marked as a carry on, this is a hippie mixie
				result.last_position.buffer_pos = buffer_pos + 1;
			} else {
				result.last_position.buffer_pos = buffer_pos + 2;
			}
		} else {
			result.last_position.buffer_pos = buffer_pos + 1;
		}
	}

	// We add the value
	return result.AddRowInternal();
}